

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall lest::to_string_abi_cxx11_(lest *this,char **txt)

{
  char *pcVar1;
  allocator local_99;
  string local_98 [32];
  lest local_78 [32];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  char **local_18;
  char **txt_local;
  
  pcVar1 = *txt;
  local_18 = txt;
  txt_local = (char **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,pcVar1,&local_99);
  make_tran_string(local_78,(string *)local_98);
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c0173);
  std::operator+(local_38,(char *)local_58);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return this;
}

Assistant:

inline std::string to_string( char const *   const & txt ) { return "\"" + make_tran_string(                 txt   ) + "\""; }